

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomThreeAction.cpp
# Opt level: O3

ActionResults * __thiscall BlueRoomThreeAction::Drop(BlueRoomThreeAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *this_00;
  ActionResults *pAVar3;
  itemType local_3c;
  string local_38;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == BALL) {
    local_3c = BALL;
    this_00 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_3c);
    iVar2 = ItemWrapper::getLocation(this_00);
    if (iVar2 == BACKPACK) {
      pAVar3 = (ActionResults *)operator_new(0x30);
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"You really dropped the ball this time. Way to go.","");
      ActionResults::ActionResults(pAVar3,CURRENT,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        return pAVar3;
      }
      operator_delete(local_38._M_dataplus._M_p);
      return pAVar3;
    }
  }
  pAVar3 = AbstractRoomAction::Drop(&this->super_AbstractRoomAction);
  return pAVar3;
}

Assistant:

ActionResults *BlueRoomThreeAction::Drop() {
    if(commands->getMainItem() == BALL && itemList->getValue(BALL)->getLocation() == BACKPACK) {
        return new ActionResults(CURRENT, "You really dropped the ball this time. Way to go.");
    } else {
        return AbstractRoomAction::Drop();
    }
}